

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

int CountNewlines(LPCOLESTR psz)

{
  LPCOLESTR pOVar1;
  int local_14;
  LPCOLESTR pOStack_10;
  int cln;
  LPCOLESTR psz_local;
  
  local_14 = 0;
  pOVar1 = psz;
LAB_015ea2df:
  pOStack_10 = pOVar1;
  if (*pOStack_10 == L'\0') {
    return local_14;
  }
  pOVar1 = pOStack_10 + 1;
  if (*pOStack_10 != L'\n') goto LAB_015ea308;
  goto LAB_015ea32c;
LAB_015ea308:
  if (*pOStack_10 == L'\r') {
    if (*pOVar1 == L'\n') {
      pOVar1 = pOStack_10 + 2;
    }
LAB_015ea32c:
    pOStack_10 = pOVar1;
    local_14 = local_14 + 1;
    pOVar1 = pOStack_10;
  }
  goto LAB_015ea2df;
}

Assistant:

int CountNewlines(LPCOLESTR psz)
{
    int cln = 0;

    while (0 != *psz)
    {
        switch (*psz++)
        {
        case _u('\xD'):
            if (*psz == _u('\xA'))
            {
                ++psz;
            }
            // fall-through
        case _u('\xA'):
            cln++;
            break;
        }
    }

    return cln;
}